

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

void __thiscall Timer::~Timer(Timer *this)

{
  TimeEvent *this_00;
  bool bVar1;
  reference ppTVar2;
  TimeEvent *timer;
  iterator __end1;
  iterator __begin1;
  set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_> *__range1;
  Timer *this_local;
  
  __end1 = std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::begin
                     (&this->timers);
  timer = (TimeEvent *)
          std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::end
                    (&this->timers);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&timer);
    if (!bVar1) break;
    ppTVar2 = std::_Rb_tree_const_iterator<TimeEvent_*>::operator*(&__end1);
    this_00 = *ppTVar2;
    this_00->manager = (Timer *)0x0;
    if (this_00 != (TimeEvent *)0x0) {
      TimeEvent::~TimeEvent(this_00);
      operator_delete(this_00,0x30);
    }
    std::_Rb_tree_const_iterator<TimeEvent_*>::operator++(&__end1);
  }
  std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::clear(&this->timers);
  std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::~set(&this->execlist)
  ;
  std::set<TimeEvent_*,_std::less<TimeEvent_*>,_std::allocator<TimeEvent_*>_>::~set(&this->timers);
  std::unique_ptr<Timer::impl_t,_std::default_delete<Timer::impl_t>_>::~unique_ptr(&this->impl);
  return;
}

Assistant:

Timer::~Timer()
{
	UTIL_FOREACH(this->timers, timer)
	{
		timer->manager = 0;
		delete timer;
	}
	this->timers.clear();

#ifdef WIN32
	if (rres != 0)
	{
		timeEndPeriod(rres);
		rres = 0;
	}
#endif // WIN32
}